

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

void __thiscall Wasm::WasmBytecodeGenerator::EmitBr(WasmBytecodeGenerator *this)

{
  uint uVar1;
  WasmBinaryReader *pWVar2;
  BlockInfo *blockInfo;
  PolymorphicEmitInfo PVar3;
  PolymorphicEmitInfo polyExpr;
  undefined1 local_30 [8];
  PolymorphicEmitInfo info;
  
  pWVar2 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar2 == (WasmBinaryReader *)0x0) {
    pWVar2 = (this->m_module->m_reader).ptr;
  }
  blockInfo = GetBlockInfo(this,(pWVar2->super_WasmReaderBase).m_currentNode.field_1.brTable.
                                numTargets);
  uVar1 = (blockInfo->yieldInfo).count;
  PVar3._4_4_ = 0;
  PVar3.count = uVar1;
  if (uVar1 != 0) {
    PVar3.field_1.infos = (blockInfo->yieldInfo).field_1.infos;
    PVar3 = PopStackPolymorphic(this,PVar3,(char16 *)0x0);
    info._0_8_ = PVar3.field_1;
    local_30._0_4_ = PVar3.count;
    polyExpr._4_4_ = 0;
    polyExpr.count = local_30._0_4_;
    polyExpr.field_1 =
         (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)
         (anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1)info._0_8_;
    YieldToBlock(this,blockInfo,polyExpr);
    ReleaseLocation(this,(PolymorphicEmitInfo *)local_30);
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
            (this->m_writer,(ulong)(uint)blockInfo->label,0x25);
  SetUnreachableState(this,true);
  return;
}

Assistant:

void WasmBytecodeGenerator::EmitBr()
{
    uint32 depth = GetReader()->m_currentNode.br.depth;

    BlockInfo* blockInfo = GetBlockInfo(depth);
    if (blockInfo->HasYield())
    {
        PolymorphicEmitInfo info = PopStackPolymorphic(blockInfo);
        YieldToBlock(blockInfo, info);
        ReleaseLocation(&info);
    }
    m_writer->AsmBr(blockInfo->label);
    SetUnreachableState(true);
}